

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageOperations.cpp
# Opt level: O1

void glcts::fillData<unsigned_int>
               (uint *data,GLuint width,GLuint height,GLuint depth,GLuint components,uint base)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  GLuint GVar5;
  GLuint GVar6;
  GLuint GVar7;
  uint local_44;
  
  if (depth != 0) {
    local_44 = 0;
    GVar6 = 0;
    do {
      if (width != 0) {
        GVar7 = 0;
        uVar3 = local_44;
        do {
          if (height != 0) {
            GVar5 = 0;
            uVar2 = uVar3;
            do {
              uVar1 = (ulong)components;
              uVar4 = uVar2;
              if (components != 0) {
                do {
                  data[uVar4] = GVar6 + base;
                  uVar4 = uVar4 + 1;
                  uVar1 = uVar1 - 1;
                } while (uVar1 != 0);
              }
              GVar5 = GVar5 + 1;
              uVar2 = uVar2 + components;
            } while (GVar5 != height);
          }
          GVar7 = GVar7 + 1;
          uVar3 = uVar3 + components * height;
        } while (GVar7 != width);
      }
      GVar6 = GVar6 + 1;
      local_44 = local_44 + components * height * width;
    } while (GVar6 != depth);
  }
  return;
}

Assistant:

void fillData(T* data, glw::GLuint width, glw::GLuint height, glw::GLuint depth, glw::GLuint components, T base)
{
	for (glw::GLuint i = 0; i < depth; ++i)
	{
		for (glw::GLuint j = 0; j < width; ++j)
		{
			for (glw::GLuint k = 0; k < height; ++k)
			{
				for (glw::GLuint l = 0; l < components; ++l)
				{
					data[i * width * height * components + j * height * components + k * components + l] = base + (T)i;
				}
			}
		}
	}
}